

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O2

void dump(FILE *stream)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  pointer puVar5;
  allocator_type local_71;
  uint64_t mech;
  uint8_t value;
  pointer puStack_60;
  pointer local_58;
  uint64_t disktype;
  uint64_t p11type;
  uint64_t gen;
  
  bVar3 = readULong(stream,&gen);
  if (!bVar3) {
    iVar4 = feof((FILE *)stream);
    if (iVar4 != 0) {
      puts("empty file");
      return;
    }
    corrupt(stream);
    return;
  }
  dumpULong(gen,false);
  printf("generation %lu\n",gen);
LAB_0010792d:
  iVar4 = feof((FILE *)stream);
  if (iVar4 != 0) {
    return;
  }
  bVar3 = readULong(stream,&p11type);
  uVar1 = p11type;
  if (!bVar3) goto LAB_00107c52;
  dumpULong(p11type,false);
  if (uVar1 >> 0x20 == 0) {
    dumpCKA(uVar1,0x30);
    putchar(10);
  }
  else {
    puts("overflow attribute type");
  }
  bVar3 = readULong(stream,&disktype);
  uVar2 = disktype;
  if (!bVar3) goto LAB_00107c52;
  dumpULong(disktype,false);
  switch(uVar2) {
  case 1:
    puts("boolean attribute");
    bVar3 = readBool(stream,&value);
    if (!bVar3) goto LAB_00107c52;
    dumpBool(value,false);
    break;
  case 2:
    puts("unsigned long attribute");
    bVar3 = readULong(stream,(uint64_t *)&value);
    puVar5 = _value;
    if (!bVar3) goto LAB_00107c52;
    dumpULong((uint64_t)_value,false);
    dumpCKx(uVar1,(uint64_t)puVar5,0x30);
    break;
  case 3:
    puts("byte string attribute");
    bVar3 = readULong(stream,&mech);
    uVar1 = mech;
    if (!bVar3) goto LAB_00107c52;
    dumpULong(mech,false);
    if (0x3fffffff < uVar1) goto LAB_00107c38;
    printf("(length %lu)\n",uVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value,uVar1,&local_71);
    bVar3 = readBytes(stream,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
    if (bVar3) {
      dumpBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value,false);
    }
    else {
      corrupt(stream);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
    goto LAB_00107bf1;
  case 4:
    puts("attribute map attribute");
    bVar3 = readULong(stream,&mech);
    uVar1 = mech;
    if (!bVar3) goto LAB_00107c52;
    dumpULong(mech,false);
    if (0x3fffffff < uVar1) goto LAB_00107c38;
    printf("(length %lu)\n",uVar1);
    _value = (pointer)0x0;
    puStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    bVar3 = readMap(stream,uVar1,
                    (vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                     *)&value);
    if (bVar3) {
      dumpMap((va_type *)&value);
    }
    else {
      corrupt(stream);
    }
    std::
    vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
    ::~vector((vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               *)&value);
LAB_00107bf1:
    if (bVar3 == false) {
      return;
    }
    goto LAB_0010792d;
  case 5:
    puts("mechanism set attribute");
    bVar3 = readULong(stream,(uint64_t *)&value);
    puVar5 = _value;
    if (!bVar3) goto LAB_00107c52;
    dumpULong((uint64_t)_value,false);
    if ((pointer)0x3fffffff < puVar5) {
LAB_00107c38:
      puts("overflow length...");
      return;
    }
    printf("(length %lu)\n",puVar5);
    while (bVar3 = puVar5 != (pointer)0x0, puVar5 = puVar5 + -1, bVar3) {
      bVar3 = readULong(stream,&mech);
      uVar1 = mech;
      if (!bVar3) goto LAB_00107c52;
      dumpULong(mech,false);
      dumpCKM(uVar1,0x30);
      putchar(10);
    }
    goto LAB_0010792d;
  default:
    puts("unknown attribute format");
LAB_00107c52:
    corrupt(stream);
    return;
  }
  putchar(10);
  goto LAB_0010792d;
}

Assistant:

void dump(FILE* stream)
{
	uint64_t gen;
	if (!readULong(stream, gen))
	{
		if (feof(stream))
		{
			printf("empty file\n");
		}
		else
		{
			corrupt(stream);
		}
		return;
	}
	dumpULong(gen);
	printf("generation %lu\n", (unsigned long) gen);

	while (!feof(stream))
	{
		uint64_t p11type;
		if (!readULong(stream, p11type))
		{
			corrupt(stream);
			return;
		}
		dumpULong(p11type);
		if ((uint64_t)((uint32_t)p11type) != p11type)
		{
			printf("overflow attribute type\n");
		}
		else
		{
			dumpCKA((unsigned long) p11type, 48);
			printf("\n");
		}

		uint64_t disktype;
		if (!readULong(stream, disktype))
		{
			corrupt(stream);
			return;
		}
		dumpULong(disktype);
		switch (disktype)
		{
		case BOOLEAN_ATTR:
			printf("boolean attribute\n");
			break;
		case ULONG_ATTR:
			printf("unsigned long attribute\n");
			break;
		case BYTES_ATTR:
			printf("byte string attribute\n");
			break;
		case ATTRMAP_ATTR:
			printf("attribute map attribute\n");
			break;
		case MECHSET_ATTR:
			printf("mechanism set attribute\n");
			break;
		default:
			printf("unknown attribute format\n");
			break;
		}

		if (disktype == BOOLEAN_ATTR)
		{
			uint8_t value;
			if (!readBool(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBool(value);
			printf("\n");
		}
		else if (disktype == ULONG_ATTR)
		{
			uint64_t value;
			if (!readULong(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpULong(value);
			dumpCKx(p11type, value, 48);
			printf("\n");
		}
		else if (disktype == BYTES_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<uint8_t> value((size_t) len);
			if (!readBytes(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBytes(value);
		}
		else if (disktype == ATTRMAP_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<Attribute> value;
			if (!readMap(stream, len, value))
			{
				corrupt(stream);
				return;
			}
			dumpMap(value);
		}
		else if (disktype == MECHSET_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			for (unsigned long i = 0; i < len; i++)
			{
				uint64_t mech;
				if (!readULong(stream, mech))
				{
					corrupt(stream);
					return;
				}
				dumpULong(mech);
				dumpCKM(mech, 48);
				printf("\n");
			}
		}
		else
		{
			corrupt(stream);
			return;
		}
	}
}